

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpAuxNoReg
               (OpCode op,OpLayoutAuxNoReg *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  AuxArray<Js::FuncInfoEntry> *pAVar4;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  undefined6 in_register_0000003a;
  uint i;
  ulong uVar7;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0xda) {
    pAVar4 = ByteCodeReader::ReadAuxArray<Js::FuncInfoEntry>(playout->Offset,dumpFunction);
    Output::Print(L" %d [",(ulong)pAVar4->count);
    for (uVar7 = 0; (uVar7 < 3 && (uVar7 < pAVar4->count)); uVar7 = uVar7 + 1) {
      pPVar5 = ParseableFunctionInfo::GetNestedFunctionForExecution
                         (&dumpFunction->super_ParseableFunctionInfo,pAVar4[uVar7 * 2 + 1].count);
      if (uVar7 != 0) {
        Output::Print(L", ");
      }
      iVar3 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pPVar5);
      Output::Print(L"%s",CONCAT44(extraout_var,iVar3));
    }
    Output::Print(L"]");
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x58b,"(false)","Unknown OpCode for OpLayoutType::AuxNoReg");
  if (bVar2) {
    *puVar6 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
    ByteCodeDumper::DumpAuxNoReg(OpCode op, const unaligned OpLayoutAuxNoReg * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitCachedFuncs:
            {
                const Js::FuncInfoArray *arr = reader.ReadAuxArray<FuncInfoEntry>(playout->Offset, dumpFunction);
                Output::Print(_u(" %d ["), arr->count);
                for (uint i = 0; i < arr->count && i < 3; i++)
                {
                    Js::ParseableFunctionInfo *info = dumpFunction->GetNestedFunctionForExecution(arr->elements[i].nestedIndex);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), info->GetDisplayName());
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::AuxNoReg");
                break;
        }
    }